

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::ContentEncoding::~ContentEncoding(ContentEncoding *this)

{
  ContentCompression **ppCVar1;
  ContentCompression *this_00;
  ContentEncryption **ppCVar2;
  ContentEncryption *this_01;
  ContentCompression **ppCVar3;
  ContentEncryption **ppCVar4;
  
  ppCVar3 = this->compression_entries_;
  ppCVar1 = this->compression_entries_end_;
  if (ppCVar3 != ppCVar1) {
    do {
      this_00 = *ppCVar3;
      if (this_00 != (ContentCompression *)0x0) {
        ContentCompression::~ContentCompression(this_00);
      }
      ppCVar3 = ppCVar3 + 1;
      operator_delete(this_00);
    } while (ppCVar3 != ppCVar1);
    ppCVar3 = this->compression_entries_;
  }
  if (ppCVar3 != (ContentCompression **)0x0) {
    operator_delete__(ppCVar3);
  }
  ppCVar4 = this->encryption_entries_;
  ppCVar2 = this->encryption_entries_end_;
  if (ppCVar4 != ppCVar2) {
    do {
      this_01 = *ppCVar4;
      if (this_01 != (ContentEncryption *)0x0) {
        ContentEncryption::~ContentEncryption(this_01);
      }
      ppCVar4 = ppCVar4 + 1;
      operator_delete(this_01);
    } while (ppCVar4 != ppCVar2);
    ppCVar4 = this->encryption_entries_;
  }
  if (ppCVar4 != (ContentEncryption **)0x0) {
    operator_delete__(ppCVar4);
    return;
  }
  return;
}

Assistant:

ContentEncoding::~ContentEncoding() {
  ContentCompression** comp_i = compression_entries_;
  ContentCompression** const comp_j = compression_entries_end_;

  while (comp_i != comp_j) {
    ContentCompression* const comp = *comp_i++;
    delete comp;
  }

  delete[] compression_entries_;

  ContentEncryption** enc_i = encryption_entries_;
  ContentEncryption** const enc_j = encryption_entries_end_;

  while (enc_i != enc_j) {
    ContentEncryption* const enc = *enc_i++;
    delete enc;
  }

  delete[] encryption_entries_;
}